

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O1

mk_rconf * mk_rconf_open(char *path)

{
  int iVar1;
  mk_rconf *conf;
  time_t tVar2;
  char *pcVar3;
  char path_1 [4097];
  char acStack_1018 [4104];
  
  if (path == (char *)0x0) {
    conf = (mk_rconf *)0x0;
    mk_print(0x1002,"[config] invalid path file %s",0);
  }
  else {
    conf = (mk_rconf *)calloc(1,0x48);
    if (conf == (mk_rconf *)0x0) {
      perror("malloc");
    }
    tVar2 = time((time_t *)0x0);
    conf->created = (int)tVar2;
    pcVar3 = mk_string_dup(path);
    conf->file = pcVar3;
    conf->level = -1;
    (conf->sections).next = &conf->sections;
    (conf->sections).prev = &conf->sections;
    (conf->includes).next = &conf->includes;
    (conf->includes).prev = &conf->includes;
    (conf->metas).next = &conf->metas;
    (conf->metas).prev = &conf->metas;
    pcVar3 = realpath(path,acStack_1018);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = strrchr(acStack_1018,0x2f);
      if (pcVar3 != (char *)0x0) {
        pcVar3[1] = '\0';
        pcVar3 = mk_string_dup(acStack_1018);
        conf->root_path = pcVar3;
      }
    }
    iVar1 = mk_rconf_read(conf,path);
    if (iVar1 == -1) {
      mk_rconf_free(conf);
      conf = (mk_rconf *)0x0;
    }
  }
  return conf;
}

Assistant:

struct mk_rconf *mk_rconf_open(const char *path)
{
    int ret;
    struct mk_rconf *conf = NULL;

    if (!path) {
        mk_warn("[config] invalid path file %s", path);
        return NULL;
    }

    /* Alloc configuration node */
    conf = mk_mem_alloc_z(sizeof(struct mk_rconf));
    if (!conf) {
        perror("malloc");
        return NULL;
    }
    conf->created = time(NULL);
    conf->file = mk_string_dup(path);
    conf->level = -1;
    mk_list_init(&conf->sections);
    mk_list_init(&conf->includes);
    mk_list_init(&conf->metas);

    /* Set the absolute path for the entrypoint file */
    mk_rconf_path_set(conf, (char *) path);

    /* Read entrypoint */
    ret = mk_rconf_read(conf, path);
    if (ret == -1) {
        mk_rconf_free(conf);
        return NULL;
    }

    return conf;
}